

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void lj_record_ret(jit_State *J,BCReg rbase,ptrdiff_t gotresults)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  TValue *pTVar5;
  bool bVar6;
  TRef local_158;
  TRef local_154;
  TRef local_14c;
  TValue *local_148;
  TValue TStack_138;
  BCReg dst_1;
  TValue save;
  TValue *b;
  TRef tr;
  BCReg bslot;
  BCReg dst;
  BCReg cbase_3;
  ASMFunction cont;
  TRef trpc;
  TRef trpt;
  GCproto *pt;
  TValue *pTStack_f8;
  BCReg cbase_2;
  ptrdiff_t nresults;
  int local_e8;
  BCIns callins;
  BCReg cbase_1;
  BCReg cbase;
  ptrdiff_t i;
  TValue *frame;
  ptrdiff_t gotresults_local;
  jit_State *pjStack_c0;
  BCReg rbase_local;
  jit_State *J_local;
  jit_State *local_b0;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  undefined8 *local_80;
  undefined8 *local_78;
  lua_State *local_70;
  TValue *local_68;
  undefined1 *local_60;
  lua_State *local_58;
  char *local_50;
  undefined1 *local_48;
  lua_State *local_40;
  char *local_38;
  undefined8 *local_30;
  lua_State *local_28;
  
  i = (ptrdiff_t)(J->L->base + -1);
  frame = (TValue *)gotresults;
  gotresults_local._4_4_ = rbase;
  pjStack_c0 = J;
  for (_cbase_1 = 0; _cbase_1 < (long)frame; _cbase_1 = _cbase_1 + 1) {
    if (pjStack_c0->base[(ulong)gotresults_local._4_4_ + _cbase_1] == 0) {
      sload(pjStack_c0,gotresults_local._4_4_ + (int)_cbase_1);
    }
  }
  while ((*(ulong *)i & 6) == 6) {
    lVar1 = *(long *)i;
    callins = (BCIns)(lVar1 >> 3);
    iVar2 = pjStack_c0->framedepth + -1;
    pjStack_c0->framedepth = iVar2;
    if (iVar2 < 1) {
      lj_trace_err(pjStack_c0,LJ_TRERR_NYIRETL);
    }
    frame = (TValue *)((long)&(frame->gcr).gcptr64 + 1);
    pjStack_c0->baseslot = pjStack_c0->baseslot - callins;
    pjStack_c0->base = pjStack_c0->base + -(lVar1 >> 3 & 0xffffffffU);
    gotresults_local._4_4_ = (callins + gotresults_local._4_4_) - 1;
    pjStack_c0->base[gotresults_local._4_4_] = 0x2007ffd;
    i = i - (*(ulong *)i & 0xfffffffffffffff8);
    pjStack_c0->needsnap = '\x01';
  }
  if ((pjStack_c0->framedepth == 0) && (pjStack_c0->pt != (GCproto *)0x0)) {
    local_9c = *pjStack_c0->pc & 0xff;
    bVar6 = true;
    if ((local_9c != 0x49) && ((bVar6 = true, local_9c != 0x4a && (bVar6 = true, local_9c != 0x4b)))
       ) {
      bVar6 = local_9c == 0x4c;
    }
    if (bVar6) {
      if ((*(ulong *)i & 3) != 0) {
LAB_0015283f:
        for (_cbase_1 = 0; _cbase_1 < (long)(ulong)gotresults_local._4_4_; _cbase_1 = _cbase_1 + 1)
        {
          pjStack_c0->base[_cbase_1] = 0;
        }
        pjStack_c0->maxslot = gotresults_local._4_4_ + (int)frame;
        lj_record_stop(pjStack_c0,LJ_TRLINK_RETURN,0);
        return;
      }
      if ((pjStack_c0->parent == 0) && (pjStack_c0->exitno == 0)) {
        local_a0 = (pjStack_c0->cur).startins & 0xff;
        bVar6 = true;
        if ((local_a0 != 0x49) &&
           ((bVar6 = true, local_a0 != 0x4a && (bVar6 = true, local_a0 != 0x4b)))) {
          bVar6 = local_a0 == 0x4c;
        }
        if (!bVar6) goto LAB_0015283f;
      }
    }
  }
  if ((*(ulong *)i & 7) == 3) {
    lVar1 = *(long *)i;
    local_e8 = (int)(lVar1 >> 3);
    iVar2 = pjStack_c0->framedepth + -1;
    pjStack_c0->framedepth = iVar2;
    if (iVar2 < 0) {
      lj_trace_err(pjStack_c0,LJ_TRERR_NYIRETL);
    }
    gotresults_local._4_4_ = local_e8 + gotresults_local._4_4_;
    pjStack_c0->baseslot = pjStack_c0->baseslot - local_e8;
    pjStack_c0->base = pjStack_c0->base + -(lVar1 >> 3 & 0xffffffffU);
    i = i - (*(ulong *)i & 0xfffffffffffffff8);
  }
  if ((*(ulong *)i & 3) == 0) {
    nresults._4_4_ = *(uint *)(*(long *)i + -4);
    if (nresults._4_4_ >> 0x18 == 0) {
      local_148 = frame;
    }
    else {
      local_148 = (TValue *)((ulong)(nresults._4_4_ >> 0x18) - 1);
    }
    pTStack_f8 = local_148;
    pt._4_4_ = nresults._4_4_ >> 8 & 0xff;
    lVar1 = *(long *)((*(ulong *)(i + -8 + (ulong)(pt._4_4_ + 2) * -8) & 0x7fffffffffff) + 0x20);
    _trpc = (GCobj *)(lVar1 + -0x68);
    if ((*(byte *)(lVar1 + -0x2b) & 8) != 0) {
      lj_trace_err(pjStack_c0,LJ_TRERR_CJITOFF);
    }
    if (((pjStack_c0->framedepth == 0) && (pjStack_c0->pt != (GCproto *)0x0)) &&
       ((TValue *)i == pjStack_c0->L->base + -1)) {
      iVar2 = check_downrec_unroll(pjStack_c0,&_trpc->pt);
      if (iVar2 != 0) {
        pjStack_c0->maxslot = gotresults_local._4_4_ + (int)frame;
        lj_snap_purge(pjStack_c0);
        lj_record_stop(pjStack_c0,LJ_TRLINK_DOWNREC,(uint)(pjStack_c0->cur).traceno);
        return;
      }
      lj_snap_add(pjStack_c0);
    }
    for (_cbase_1 = 0; _cbase_1 < (long)pTStack_f8; _cbase_1 = _cbase_1 + 1) {
      if (_cbase_1 < (long)frame) {
        local_14c = pjStack_c0->base[(ulong)gotresults_local._4_4_ + _cbase_1];
      }
      else {
        local_14c = 0x7fff;
      }
      pjStack_c0->base[_cbase_1 + -2] = local_14c;
    }
    pjStack_c0->maxslot = pt._4_4_ + (int)pTStack_f8;
    if (pjStack_c0->framedepth < 1) {
      if ((pjStack_c0->parent == 0) && (pjStack_c0->exitno == 0)) {
        local_a4 = (pjStack_c0->cur).startins & 0xff;
        bVar6 = true;
        if ((local_a4 != 0x49) &&
           ((bVar6 = true, local_a4 != 0x4a && (bVar6 = true, local_a4 != 0x4b)))) {
          bVar6 = local_a4 == 0x4c;
        }
        if (!bVar6) {
          lj_trace_err(pjStack_c0,LJ_TRERR_LLEAVE);
        }
      }
      if (pjStack_c0->needsnap != '\0') {
        lj_trace_err(pjStack_c0,LJ_TRERR_NYIRETL);
      }
      cont._4_4_ = lj_ir_kgc(pjStack_c0,_trpc,IRT_PROTO);
      cont._0_4_ = lj_ir_kptr_(pjStack_c0,IR_KPTR,*(void **)i);
      J_local._4_2_ = (IRRef1)cont._4_4_;
      local_b0 = pjStack_c0;
      J_local._6_2_ = 0xb89;
      J_local._2_2_ = (IRRef1)(TRef)cont;
      (pjStack_c0->fold).ins.field_0.ot = 0xb89;
      (pjStack_c0->fold).ins.field_0.op1 = J_local._4_2_;
      (pjStack_c0->fold).ins.field_0.op2 = J_local._2_2_;
      lj_opt_fold(pjStack_c0);
      pjStack_c0->retdepth = pjStack_c0->retdepth + 1;
      pjStack_c0->needsnap = '\x01';
      memmove(pjStack_c0->base + pt._4_4_,pjStack_c0->base + -2,(long)pTStack_f8 << 2);
      memset(pjStack_c0->base + -2,0,(ulong)(pt._4_4_ + 2) << 2);
    }
    else {
      pjStack_c0->framedepth = pjStack_c0->framedepth + -1;
      pjStack_c0->baseslot = pjStack_c0->baseslot - (pt._4_4_ + 2);
      pjStack_c0->base = pjStack_c0->base + -(ulong)(pt._4_4_ + 2);
    }
  }
  else {
    if ((*(ulong *)i & 7) != 2) {
      lj_trace_err(pjStack_c0,LJ_TRERR_NYIRETL);
    }
    _dst = *(code **)(i + -0x18);
    uVar4 = *(long *)i >> 3;
    bslot = (BCReg)uVar4;
    iVar2 = pjStack_c0->framedepth + -2;
    pjStack_c0->framedepth = iVar2;
    if (iVar2 < 0) {
      lj_trace_err(pjStack_c0,LJ_TRERR_NYIRETL);
    }
    pjStack_c0->baseslot = pjStack_c0->baseslot - bslot;
    pjStack_c0->base = pjStack_c0->base + -(uVar4 & 0xffffffff);
    pjStack_c0->maxslot = bslot - 4;
    if (_dst == lj_cont_ra) {
      uVar3 = *(uint *)(*(long *)(i + -0x10) + -4) >> 8 & 0xff;
      if (frame == (TValue *)0x0) {
        local_154 = 0x7fff;
      }
      else {
        local_154 = pjStack_c0->base[bslot + gotresults_local._4_4_];
      }
      pjStack_c0->base[uVar3] = local_154;
      if (pjStack_c0->maxslot <= uVar3) {
        pjStack_c0->maxslot = uVar3 + 1;
      }
    }
    else if ((_dst != lj_cont_nop) && (_dst == lj_cont_cat)) {
      b._4_4_ = *(uint *)(*(long *)(i + -0x10) + -4) >> 0x18;
      if (frame == (TValue *)0x0) {
        local_158 = 0x7fff;
      }
      else {
        local_158 = pjStack_c0->base[bslot + gotresults_local._4_4_];
      }
      b._0_4_ = local_158;
      if (b._4_4_ != pjStack_c0->maxslot) {
        save = (TValue)pjStack_c0->L->base;
        if (pjStack_c0->postproc != LJ_POST_NONE) {
          lj_trace_err(pjStack_c0,LJ_TRERR_NYIRETL);
        }
        pjStack_c0->base[pjStack_c0->maxslot] = local_158;
        local_58 = pjStack_c0->L;
        local_68 = (TValue *)(save.u64 - 0x20);
        local_60 = (undefined1 *)&stack0xfffffffffffffec8;
        TStack_138 = *local_68;
        local_50 = "copy of dead GC object";
        if (frame == (TValue *)0x0) {
          *(undefined8 *)(save.u64 - 0x20) = 0xffffffffffffffff;
        }
        else {
          local_70 = pjStack_c0->L;
          local_78 = (undefined8 *)(save.u64 - 0x20);
          local_80 = (undefined8 *)(save.u64 + (ulong)gotresults_local._4_4_ * 8);
          *local_78 = *local_80;
          local_38 = "copy of dead GC object";
          local_30 = local_78;
          local_28 = local_70;
        }
        pjStack_c0->L->base = (TValue *)(save.u64 + (uVar4 & 0xffffffff) * -8);
        local_48 = local_60;
        local_40 = local_58;
        b._0_4_ = rec_cat(pjStack_c0,b._4_4_,bslot - 4);
        pTVar5 = pjStack_c0->L->base + bslot;
        pjStack_c0->L->base = pTVar5;
        pTVar5[-4] = TStack_138;
      }
      if ((TRef)b != 0) {
        uVar3 = *(uint *)(*(long *)(i + -0x10) + -4) >> 8 & 0xff;
        pjStack_c0->base[uVar3] = (TRef)b;
        if (pjStack_c0->maxslot <= uVar3) {
          pjStack_c0->maxslot = uVar3 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void lj_record_ret(jit_State *J, BCReg rbase, ptrdiff_t gotresults)
{
  TValue *frame = J->L->base - 1;
  ptrdiff_t i;
  for (i = 0; i < gotresults; i++)
    (void)getslot(J, rbase+i);  /* Ensure all results have a reference. */
  while (frame_ispcall(frame)) {  /* Immediately resolve pcall() returns. */
    BCReg cbase = (BCReg)frame_delta(frame);
    if (--J->framedepth <= 0)
      lj_trace_err(J, LJ_TRERR_NYIRETL);
    lj_assertJ(J->baseslot > 1+LJ_FR2, "bad baseslot for return");
    gotresults++;
    rbase += cbase;
    J->baseslot -= (BCReg)cbase;
    J->base -= cbase;
    J->base[--rbase] = TREF_TRUE;  /* Prepend true to results. */
    frame = frame_prevd(frame);
    J->needsnap = 1;  /* Stop catching on-trace errors. */
  }
  /* Return to lower frame via interpreter for unhandled cases. */
  if (J->framedepth == 0 && J->pt && bc_isret(bc_op(*J->pc)) &&
       (!frame_islua(frame) ||
	(J->parent == 0 && J->exitno == 0 &&
	 !bc_isret(bc_op(J->cur.startins))))) {
    /* NYI: specialize to frame type and return directly, not via RET*. */
    for (i = 0; i < (ptrdiff_t)rbase; i++)
      J->base[i] = 0;  /* Purge dead slots. */
    J->maxslot = rbase + (BCReg)gotresults;
    lj_record_stop(J, LJ_TRLINK_RETURN, 0);  /* Return to interpreter. */
    return;
  }
  if (frame_isvarg(frame)) {
    BCReg cbase = (BCReg)frame_delta(frame);
    if (--J->framedepth < 0)  /* NYI: return of vararg func to lower frame. */
      lj_trace_err(J, LJ_TRERR_NYIRETL);
    lj_assertJ(J->baseslot > 1+LJ_FR2, "bad baseslot for return");
    rbase += cbase;
    J->baseslot -= (BCReg)cbase;
    J->base -= cbase;
    frame = frame_prevd(frame);
  }
  if (frame_islua(frame)) {  /* Return to Lua frame. */
    BCIns callins = *(frame_pc(frame)-1);
    ptrdiff_t nresults = bc_b(callins) ? (ptrdiff_t)bc_b(callins)-1 :gotresults;
    BCReg cbase = bc_a(callins);
    GCproto *pt = funcproto(frame_func(frame - (cbase+1+LJ_FR2)));
    if ((pt->flags & PROTO_NOJIT))
      lj_trace_err(J, LJ_TRERR_CJITOFF);
    if (J->framedepth == 0 && J->pt && frame == J->L->base - 1) {
      if (check_downrec_unroll(J, pt)) {
	J->maxslot = (BCReg)(rbase + gotresults);
	lj_snap_purge(J);
	lj_record_stop(J, LJ_TRLINK_DOWNREC, J->cur.traceno);  /* Down-rec. */
	return;
      }
      lj_snap_add(J);
    }
    for (i = 0; i < nresults; i++)  /* Adjust results. */
      J->base[i-1-LJ_FR2] = i < gotresults ? J->base[rbase+i] : TREF_NIL;
    J->maxslot = cbase+(BCReg)nresults;
    if (J->framedepth > 0) {  /* Return to a frame that is part of the trace. */
      J->framedepth--;
      lj_assertJ(J->baseslot > cbase+1+LJ_FR2, "bad baseslot for return");
      J->baseslot -= cbase+1+LJ_FR2;
      J->base -= cbase+1+LJ_FR2;
    } else if (J->parent == 0 && J->exitno == 0 &&
	       !bc_isret(bc_op(J->cur.startins))) {
      /* Return to lower frame would leave the loop in a root trace. */
      lj_trace_err(J, LJ_TRERR_LLEAVE);
    } else if (J->needsnap) {  /* Tailcalled to ff with side-effects. */
      lj_trace_err(J, LJ_TRERR_NYIRETL);  /* No way to insert snapshot here. */
    } else {  /* Return to lower frame. Guard for the target we return to. */
      TRef trpt = lj_ir_kgc(J, obj2gco(pt), IRT_PROTO);
      TRef trpc = lj_ir_kptr(J, (void *)frame_pc(frame));
      emitir(IRTG(IR_RETF, IRT_PGC), trpt, trpc);
      J->retdepth++;
      J->needsnap = 1;
      lj_assertJ(J->baseslot == 1+LJ_FR2, "bad baseslot for return");
      /* Shift result slots up and clear the slots of the new frame below. */
      memmove(J->base + cbase, J->base-1-LJ_FR2, sizeof(TRef)*nresults);
      memset(J->base-1-LJ_FR2, 0, sizeof(TRef)*(cbase+1+LJ_FR2));
    }
  } else if (frame_iscont(frame)) {  /* Return to continuation frame. */
    ASMFunction cont = frame_contf(frame);
    BCReg cbase = (BCReg)frame_delta(frame);
    if ((J->framedepth -= 2) < 0)
      lj_trace_err(J, LJ_TRERR_NYIRETL);
    J->baseslot -= (BCReg)cbase;
    J->base -= cbase;
    J->maxslot = cbase-(2<<LJ_FR2);
    if (cont == lj_cont_ra) {
      /* Copy result to destination slot. */
      BCReg dst = bc_a(*(frame_contpc(frame)-1));
      J->base[dst] = gotresults ? J->base[cbase+rbase] : TREF_NIL;
      if (dst >= J->maxslot) {
	J->maxslot = dst+1;
      }
    } else if (cont == lj_cont_nop) {
      /* Nothing to do here. */
    } else if (cont == lj_cont_cat) {
      BCReg bslot = bc_b(*(frame_contpc(frame)-1));
      TRef tr = gotresults ? J->base[cbase+rbase] : TREF_NIL;
      if (bslot != J->maxslot) {  /* Concatenate the remainder. */
	TValue *b = J->L->base, save;  /* Simulate lower frame and result. */
	/* Can't handle MM_concat + CALLT + fast func side-effects. */
	if (J->postproc != LJ_POST_NONE)
	  lj_trace_err(J, LJ_TRERR_NYIRETL);
	J->base[J->maxslot] = tr;
	copyTV(J->L, &save, b-(2<<LJ_FR2));
	if (gotresults)
	  copyTV(J->L, b-(2<<LJ_FR2), b+rbase);
	else
	  setnilV(b-(2<<LJ_FR2));
	J->L->base = b - cbase;
	tr = rec_cat(J, bslot, cbase-(2<<LJ_FR2));
	b = J->L->base + cbase;  /* Undo. */
	J->L->base = b;
	copyTV(J->L, b-(2<<LJ_FR2), &save);
      }
      if (tr) {  /* Store final result. */
	BCReg dst = bc_a(*(frame_contpc(frame)-1));
	J->base[dst] = tr;
	if (dst >= J->maxslot) {
	  J->maxslot = dst+1;
	}
      }  /* Otherwise continue with another __concat call. */
    } else {
      /* Result type already specialized. */
      lj_assertJ(cont == lj_cont_condf || cont == lj_cont_condt,
		 "bad continuation type");
    }
  } else {
    lj_trace_err(J, LJ_TRERR_NYIRETL);  /* NYI: handle return to C frame. */
  }
  lj_assertJ(J->baseslot >= 1+LJ_FR2, "bad baseslot for return");
}